

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Ret(w3Interp *this)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  w3StackValue *pwVar4;
  undefined1 local_50 [8];
  w3StackValue result;
  size_t arity;
  w3FunctionType *function_type;
  w3Interp *this_local;
  
  bVar1 = w3Stack::empty(&this->super_w3Stack);
  if (bVar1) {
    AssertFailed("!empty ()");
  }
  if (this->frame == (w3Frame *)0x0) {
    AssertFailed("frame");
  }
  result.label.continuation =
       std::vector<w3Tag,_std::allocator<w3Tag>_>::size(&this->frame->function_type->results);
  if ((result.label.continuation != 0) && (result.label.continuation != 1)) {
    AssertFailed("arity == 0 || arity == 1");
  }
  sVar3 = w3Stack::size(&this->super_w3Stack);
  if (sVar3 <= result.label.continuation) {
    AssertFailed("size () > arity");
  }
  w3StackValue::w3StackValue((w3StackValue *)local_50);
  if (result.label.continuation != 0) {
    pwVar4 = w3Stack::top(&this->super_w3Stack);
    memcpy(local_50,pwVar4,0x30);
    w3Stack::pop_value(&this->super_w3Stack);
  }
  while( true ) {
    bVar2 = w3Stack::empty(&this->super_w3Stack);
    bVar1 = false;
    if (!bVar2) {
      pwVar4 = w3Stack::top(&this->super_w3Stack);
      bVar1 = pwVar4->tag != Tag_Frame;
    }
    if (!bVar1) break;
    w3Stack::pop(&this->super_w3Stack);
  }
  bVar1 = w3Stack::empty(&this->super_w3Stack);
  if (bVar1) {
    AssertFailed("!empty ()");
  }
  pwVar4 = w3Stack::top(&this->super_w3Stack);
  if (pwVar4->tag != Tag_Frame) {
    AssertFailed("top ().tag == Tag_Frame");
  }
  w3Stack::pop(&this->super_w3Stack);
  if (result.label.continuation != 0) {
    w3Stack::push_value(&this->super_w3Stack,(w3StackValue *)local_50);
  }
  return;
}

Assistant:

INTERP (Ret)
{
    //__debugbreak ();

    Assert (!empty ());
    Assert (frame);

    w3FunctionType* function_type = frame->function_type;
    size_t arity = function_type->results.size ();
    Assert (arity == 0 || arity == 1);
    Assert (size () > arity);

    w3StackValue result;
    if (arity)
    {
        result = top ();
        pop_value ();
    }
    while (!empty () && top ().tag != Tag_Frame)
        pop ();

    Assert (!empty ());
    Assert (top ().tag == Tag_Frame);
//    frame = top ().frame; // TODO Why this is not working?
    pop ();

    if (arity)
        push_value (result);
}